

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O1

MPP_RET jpege_proc_jpeg_cfg(MppEncJpegCfg *dst,MppEncJpegCfg *src,MppEncRcCfg *rc)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  RK_S32 RVar4;
  RK_U8 *pRVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  RK_U8 *pRVar12;
  RK_U8 *pRVar13;
  RK_U8 *pRVar14;
  RK_S32 RVar15;
  undefined4 uVar16;
  RK_U32 RVar17;
  RK_S32 RVar18;
  RK_S32 RVar19;
  RK_S32 RVar20;
  int iVar21;
  RK_U8 *pRVar22;
  char *pcVar23;
  long lVar24;
  short sVar25;
  ulong uVar26;
  MPP_RET MVar27;
  MppEncJpegCfg bak;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar29;
  undefined8 uVar28;
  
  uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar2 = src->change;
  if (uVar2 == 0) {
    return MPP_OK;
  }
  RVar17 = dst->change;
  RVar18 = dst->quant;
  RVar19 = dst->q_factor;
  RVar20 = dst->qf_max;
  RVar15 = dst->qf_min;
  uVar16 = *(undefined4 *)&dst->field_0x14;
  pRVar12 = dst->qtable_y;
  pRVar13 = dst->qtable_u;
  pRVar14 = dst->qtable_v;
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 4) != 0) {
      if (src->q_factor - 100U < 0xffffff9d) {
        _mpp_log_l(2,"jpege_api_v2","q_factor out of range, default set 80\n","jpege_proc_jpeg_cfg")
        ;
        src->q_factor = 0x50;
      }
      uVar3 = src->q_factor;
      if (dst->q_factor == uVar3) {
LAB_001ca08a:
        MVar27 = MPP_OK;
      }
      else {
        if (dst->qtable_y == (RK_U8 *)0x0) {
          pRVar22 = (RK_U8 *)mpp_osal_malloc("jpege_gen_qt_by_qfactor",0x40);
          dst->qtable_y = pRVar22;
        }
        if (dst->qtable_u == (RK_U8 *)0x0) {
          pRVar22 = (RK_U8 *)mpp_osal_malloc("jpege_gen_qt_by_qfactor",0x40);
          dst->qtable_u = pRVar22;
        }
        pRVar22 = dst->qtable_y;
        if ((pRVar22 != (RK_U8 *)0x0) && (pRVar5 = dst->qtable_u, pRVar5 != (RK_U8 *)0x0)) {
          if (uVar3 < 0x32) {
            iVar21 = (int)(5000 / (ulong)uVar3);
          }
          else {
            iVar21 = uVar3 * -2 + 200;
          }
          lVar24 = 0;
          do {
            sVar25 = (short)(((uint)"\x10\v\n\x10\x18(3=\f\f\x0e\x13\x1a:<7\x0e\r\x10\x18(9E8\x0e\x11\x16\x1d3WP>\x12\x16%8DmgM\x18#7@Qhq\\1@NWgyxeH\\_bpdgc"
                                    [lVar24] * iVar21 + 0x32) / 100);
            if (0xfe < sVar25) {
              sVar25 = 0xff;
            }
            if (sVar25 < 2) {
              sVar25 = 1;
            }
            bVar1 = "\x11\x12\x18/cccc\x12\x15\x1aBcccc\x18\x1a8ccccc/Bcccccccccccccccccccccccccccccccccccccc"
                    [lVar24];
            pRVar22[lVar24] = (RK_U8)sVar25;
            sVar25 = (short)(((uint)bVar1 * iVar21 + 0x32) / 100);
            if (0xfe < sVar25) {
              sVar25 = 0xff;
            }
            if (sVar25 < 2) {
              sVar25 = 1;
            }
            pRVar5[lVar24] = (RK_U8)sVar25;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x40);
          goto LAB_001ca08a;
        }
        _mpp_log_l(2,"jpege_api_v2","qtable is null, malloc err","jpege_gen_qt_by_qfactor");
        MVar27 = MPP_ERR_MALLOC;
      }
      dst->q_factor = src->q_factor;
      if (src->qf_min - 100U < 0xffffff9d) {
        _mpp_log_l(2,"jpege_api_v2","qf_min out of range, default set 1\n","jpege_proc_jpeg_cfg");
        src->qf_min = 1;
      }
      dst->qf_min = src->qf_min;
      if (src->qf_max - 100U < 0xffffff9d) {
        _mpp_log_l(2,"jpege_api_v2","qf_max out of range, default set 99\n","jpege_proc_jpeg_cfg");
        src->qf_max = 99;
      }
      RVar4 = src->qf_max;
      dst->qf_max = RVar4;
      if (((byte)jpege_debug & 0x10) != 0) {
        uVar28 = CONCAT44(uVar29,RVar4);
        _mpp_log_l(4,"jpege_api_v2","q_factor %d, qf_min %d, qf_max %d\n",(char *)0x0,
                   (ulong)(uint)dst->q_factor,(ulong)(uint)dst->qf_min,uVar28);
        uVar29 = (undefined4)((ulong)uVar28 >> 0x20);
      }
      goto LAB_001ca13f;
    }
    MVar27 = MPP_OK;
    if ((uVar2 & 2) == 0) goto LAB_001ca13f;
    if (((src->qtable_y == (RK_U8 *)0x0) || (src->qtable_u == (RK_U8 *)0x0)) ||
       (src->qtable_v == (RK_U8 *)0x0)) {
      pRVar22 = src->qtable_v;
      _mpp_log_l(2,"jpege_api_v2","invalid qtable y %p u %p v %p\n","jpege_proc_jpeg_cfg",
                 src->qtable_y,src->qtable_u,pRVar22);
      uVar29 = (undefined4)((ulong)pRVar22 >> 0x20);
      MVar27 = MPP_ERR_NULL_PTR;
      goto LAB_001ca13f;
    }
    if (dst->qtable_y == (RK_U8 *)0x0) {
      pRVar22 = (RK_U8 *)mpp_osal_malloc("jpege_proc_jpeg_cfg",0x40);
      dst->qtable_y = pRVar22;
    }
    if (dst->qtable_u == (RK_U8 *)0x0) {
      pRVar22 = (RK_U8 *)mpp_osal_malloc("jpege_proc_jpeg_cfg",0x40);
      dst->qtable_u = pRVar22;
    }
    uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if ((dst->qtable_y == (RK_U8 *)0x0) || (dst->qtable_u == (RK_U8 *)0x0)) {
      _mpp_log_l(2,"jpege_api_v2","qtable is null, malloc err\n","jpege_proc_jpeg_cfg");
      return MPP_ERR_MALLOC;
    }
    if (src->qtable_u != src->qtable_v) {
      lVar24 = 0;
LAB_001c9e4a:
      if (src->qtable_u[lVar24] == src->qtable_v[lVar24]) goto code_r0x001c9e58;
      if (((byte)jpege_debug & 0x10) != 0) {
        _mpp_log_l(4,"jpege_api_v2","qtable_u and qtable_v are different, use qtable_u\n",
                   (char *)0x0);
      }
      uVar26 = 0;
      do {
        if (((byte)jpege_debug & 0x10) != 0) {
          in_stack_ffffffffffffff88 =
               CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)uVar26);
          _mpp_log_l(4,"jpege_api_v2","qtable_u[%d] %d qtable_v[%d] %d\n",(char *)0x0,
                     uVar26 & 0xffffffff,(ulong)src->qtable_u[uVar26],in_stack_ffffffffffffff88,
                     (uint)src->qtable_v[uVar26]);
        }
        uVar29 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        uVar26 = uVar26 + 1;
      } while (uVar26 != 0x40);
    }
LAB_001ca274:
    pRVar22 = dst->qtable_y;
    pRVar5 = src->qtable_y;
    uVar28 = *(undefined8 *)pRVar5;
    uVar6 = *(undefined8 *)(pRVar5 + 8);
    uVar7 = *(undefined8 *)(pRVar5 + 0x10);
    uVar8 = *(undefined8 *)(pRVar5 + 0x18);
    uVar9 = *(undefined8 *)(pRVar5 + 0x20);
    uVar10 = *(undefined8 *)(pRVar5 + 0x28);
    uVar11 = *(undefined8 *)(pRVar5 + 0x38);
    *(undefined8 *)(pRVar22 + 0x30) = *(undefined8 *)(pRVar5 + 0x30);
    *(undefined8 *)(pRVar22 + 0x38) = uVar11;
    *(undefined8 *)(pRVar22 + 0x20) = uVar9;
    *(undefined8 *)(pRVar22 + 0x28) = uVar10;
    *(undefined8 *)(pRVar22 + 0x10) = uVar7;
    *(undefined8 *)(pRVar22 + 0x18) = uVar8;
    *(undefined8 *)pRVar22 = uVar28;
    *(undefined8 *)(pRVar22 + 8) = uVar6;
    pRVar22 = dst->qtable_u;
    pRVar5 = src->qtable_u;
    uVar28 = *(undefined8 *)pRVar5;
    uVar6 = *(undefined8 *)(pRVar5 + 8);
    uVar7 = *(undefined8 *)(pRVar5 + 0x10);
    uVar8 = *(undefined8 *)(pRVar5 + 0x18);
    uVar9 = *(undefined8 *)(pRVar5 + 0x20);
    uVar10 = *(undefined8 *)(pRVar5 + 0x28);
    uVar11 = *(undefined8 *)(pRVar5 + 0x38);
    *(undefined8 *)(pRVar22 + 0x30) = *(undefined8 *)(pRVar5 + 0x30);
    *(undefined8 *)(pRVar22 + 0x38) = uVar11;
    *(undefined8 *)(pRVar22 + 0x20) = uVar9;
    *(undefined8 *)(pRVar22 + 0x28) = uVar10;
    *(undefined8 *)(pRVar22 + 0x10) = uVar7;
    *(undefined8 *)(pRVar22 + 0x18) = uVar8;
    *(undefined8 *)pRVar22 = uVar28;
    *(undefined8 *)(pRVar22 + 8) = uVar6;
    MVar27 = MPP_OK;
    if (rc->rc_mode == MPP_ENC_RC_MODE_FIXQP) goto LAB_001ca13f;
    pcVar23 = strof_rc_mode(rc->rc_mode);
    _mpp_log_l(4,"jpege_api_v2","setup qtable will change mode %s fixqp",(char *)0x0,pcVar23);
  }
  else {
    uVar3 = src->quant;
    dst->quant = uVar3;
    if (10 < uVar3) {
      _mpp_log_l(2,"jpege_api_v2",
                 "invalid quality level %d is not in range [0..10] set to default 8\n",
                 "jpege_proc_jpeg_cfg");
      dst->quant = 8;
    }
    MVar27 = MPP_OK;
    if (rc->rc_mode == MPP_ENC_RC_MODE_FIXQP) goto LAB_001ca13f;
    uVar3 = dst->quant;
    pcVar23 = strof_rc_mode(rc->rc_mode);
    _mpp_log_l(4,"jpege_api_v2","setup quant %d change mode %s fixqp",(char *)0x0,(ulong)uVar3,
               pcVar23);
  }
  MVar27 = MPP_OK;
  rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
LAB_001ca13f:
  if (MVar27 == MPP_OK) {
    if (((byte)jpege_debug & 0x40) != 0) {
      _mpp_log_l(4,"jpege_api_v2","MPP_ENC_SET_CODEC_CFG change 0x%x jpeg quant %d q_factor %d\n",
                 (char *)0x0,(ulong)uVar2,(ulong)(uint)dst->quant,CONCAT44(uVar29,dst->q_factor));
    }
    dst->change = src->change;
  }
  else {
    _mpp_log_l(2,"jpege_api_v2","failed to accept new rc config\n","jpege_proc_jpeg_cfg");
    dst->qtable_u = pRVar13;
    dst->qtable_v = pRVar14;
    dst->qf_min = RVar15;
    *(undefined4 *)&dst->field_0x14 = uVar16;
    dst->qtable_y = pRVar12;
    dst->change = RVar17;
    dst->quant = RVar18;
    dst->q_factor = RVar19;
    dst->qf_max = RVar20;
  }
  dst->change = src->change;
  return MVar27;
code_r0x001c9e58:
  lVar24 = lVar24 + 1;
  if (lVar24 == 0x40) goto LAB_001ca274;
  goto LAB_001c9e4a;
}

Assistant:

static MPP_RET jpege_proc_jpeg_cfg(MppEncJpegCfg *dst, MppEncJpegCfg *src, MppEncRcCfg *rc)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncJpegCfg bak = *dst;

        if (change & MPP_ENC_JPEG_CFG_CHANGE_QP) {
            dst->quant = src->quant;
            if (dst->quant < 0 || dst->quant > 10) {
                mpp_err_f("invalid quality level %d is not in range [0..10] set to default 8\n");
                dst->quant = 8;
            }

            if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
                mpp_log("setup quant %d change mode %s fixqp", dst->quant,
                        strof_rc_mode(rc->rc_mode));
                rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
            }
        } else if (change & MPP_ENC_JPEG_CFG_CHANGE_QFACTOR) {
            if (src->q_factor < 1 || src->q_factor > 99) {
                mpp_err_f("q_factor out of range, default set 80\n");
                src->q_factor = 80;
            }
            if (dst->q_factor != src->q_factor)
                ret = jpege_gen_qt_by_qfactor(dst, &src->q_factor);

            dst->q_factor = src->q_factor;
            if (src->qf_min < 1 || src->qf_min > 99) {
                mpp_err_f("qf_min out of range, default set 1\n");
                src->qf_min = 1;
            }
            dst->qf_min = src->qf_min;
            if (src->qf_max < 1 || src->qf_max > 99) {
                mpp_err_f("qf_max out of range, default set 99\n");
                src->qf_max = 99;
            }
            dst->qf_max = src->qf_max;
            jpege_dbg_input("q_factor %d, qf_min %d, qf_max %d\n",
                            dst->q_factor, dst->qf_min, dst->qf_max);
        } else if (change & MPP_ENC_JPEG_CFG_CHANGE_QTABLE) {
            if (src->qtable_y && src->qtable_u && src->qtable_v) {
                if (NULL == dst->qtable_y)
                    dst->qtable_y = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);
                if (NULL == dst->qtable_u)
                    dst->qtable_u = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);

                if (NULL == dst->qtable_y || NULL == dst->qtable_u) {
                    mpp_err_f("qtable is null, malloc err\n");
                    return MPP_ERR_MALLOC;
                }
                /* check table value */
                if (src->qtable_u != src->qtable_v) {
                    RK_U32 i;

                    for (i = 0; i < QUANTIZE_TABLE_SIZE; i++) {
                        if (src->qtable_u[i] != src->qtable_v[i]) {
                            RK_U32 j;

                            jpege_dbg_input("qtable_u and qtable_v are different, use qtable_u\n");
                            for (j = 0; j < QUANTIZE_TABLE_SIZE; j++)
                                jpege_dbg_input("qtable_u[%d] %d qtable_v[%d] %d\n",
                                                j, src->qtable_u[j], j, src->qtable_v[j]);
                            break;
                        }
                    }
                }
                /* default use one chroma qtable, select qtable_u */
                memcpy(dst->qtable_y, src->qtable_y, QUANTIZE_TABLE_SIZE);
                memcpy(dst->qtable_u, src->qtable_u, QUANTIZE_TABLE_SIZE);

                if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
                    mpp_log("setup qtable will change mode %s fixqp",
                            strof_rc_mode(rc->rc_mode));
                    rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
                }
            } else {
                mpp_err_f("invalid qtable y %p u %p v %p\n",
                          src->qtable_y, src->qtable_u, src->qtable_v);
                ret = MPP_ERR_NULL_PTR;
            }
        }

        if (ret) {
            mpp_err_f("failed to accept new rc config\n");
            *dst = bak;
        } else {
            jpege_dbg_ctrl("MPP_ENC_SET_CODEC_CFG change 0x%x jpeg quant %d q_factor %d\n",
                           change, dst->quant, dst->q_factor);
            dst->change = src->change;
        }

        dst->change = src->change;
    }

    return ret;
}